

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

Generator * kratos::create_wrapper_flatten(Generator *top,string *wrapper_name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  size_t *__return_storage_ptr__;
  long lVar2;
  uint *puVar3;
  shared_ptr<kratos::Attribute> *psVar4;
  int iVar5;
  Generator *this_00;
  Param *pPVar6;
  _Base_ptr p_Var7;
  Var *var;
  pointer puVar8;
  undefined4 extraout_var;
  Port *pPVar9;
  InternalException *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  _Alloc_hider this_03;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  undefined1 auVar10 [8];
  shared_ptr<kratos::Attribute> *attr;
  uint *puVar11;
  shared_ptr<kratos::Attribute> *psVar12;
  ulong uVar13;
  format_args args;
  string_view format_str;
  undefined1 local_158 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
  params;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined1 local_108 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  slices;
  shared_ptr<kratos::Stmt> local_e0;
  shared_ptr<kratos::Stmt> local_d0;
  shared_ptr<kratos::Stmt> local_c0;
  pointer local_b0;
  Port *local_a8;
  Generator *local_a0;
  undefined1 auStack_98 [8];
  string name;
  shared_ptr<kratos::Port> p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_58;
  Port *local_40;
  Generator *local_38;
  
  this_00 = Context::generator(top->context_,wrapper_name);
  local_a0 = top;
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_158,
             (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
             &top->super_enable_shared_from_this<kratos::Generator>);
  local_38 = this_00;
  Generator::add_child_generator
            (this_00,&top->instance_name,(shared_ptr<kratos::Generator> *)local_158);
  if (params._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)params._M_t._M_impl._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
              *)local_158,&(local_a0->params_)._M_t);
  if (params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Rb_tree_node_base *)&params
     ) {
    this = &p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    p_Var7 = params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      pPVar6 = Generator::parameter(local_38,(string *)(p_Var7 + 1),0x20);
      (*(pPVar6->super_Const).super_Var.super_IRNode._vptr_IRNode[0x2b])
                (pPVar6,*(undefined8 *)(*(long *)(p_Var7 + 2) + 0x270));
      pPVar6 = *(Param **)(p_Var7 + 2);
      Var::as<kratos::Param>((Var *)this);
      Param::set_value(pPVar6,(shared_ptr<kratos::Param> *)this);
      if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != (_Rb_tree_node_base *)&params);
  }
  pPVar9 = (Port *)(local_a0->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8 = (Port *)&(local_a0->ports_)._M_t._M_impl.super__Rb_tree_header;
  if (pPVar9 != local_a8) {
    __return_storage_ptr__ = &params._M_t._M_impl.super__Rb_tree_header._M_node_count;
    do {
      Generator::get_port((Generator *)((long)&name.field_2 + 8),(string *)local_a0);
      if ((*(long *)(name.field_2._8_8_ + 0xa8) - (long)*(int **)(name.field_2._8_8_ + 0xa0) == 4)
         && (**(int **)(name.field_2._8_8_ + 0xa0) == 1)) {
        local_40 = Generator::port(local_38,(Port *)name.field_2._8_8_,true);
        if (*(int *)(name.field_2._8_8_ + 0x270) == 0) {
          Var::assign((Var *)&p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,(Var *)name.field_2._8_8_,(AssignmentType)local_40);
          slices.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi;
          p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          Generator::add_stmt(local_38,(shared_ptr<kratos::Stmt> *)
                                       &slices.
                                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
          }
          this_03._M_p = (pointer)(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          auStack_98 = (undefined1  [8])name.field_2._8_8_;
          name._M_dataplus._M_p =
               (pointer)p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              pvVar1 = &((p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        super_Var).super_IRNode.fn_name_ln;
              *(int *)&(pvVar1->
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start =
                   *(int *)&(pvVar1->
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1;
              UNLOCK();
            }
            else {
              pvVar1 = &((p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        super_Var).super_IRNode.fn_name_ln;
              *(int *)&(pvVar1->
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start =
                   *(int *)&(pvVar1->
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          Var::assign((Var *)&p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,(shared_ptr<kratos::Var> *)local_40,
                      (AssignmentType)auStack_98);
          local_e0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          local_e0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               p_Stack_60;
          p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          Generator::add_stmt(local_38,&local_e0);
          this_03 = name._M_dataplus;
          if (local_e0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_e0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            this_03 = name._M_dataplus;
          }
        }
        p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03._M_p !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03._M_p);
        }
        psVar12 = *(shared_ptr<kratos::Attribute> **)(name.field_2._8_8_ + 0x50);
        psVar4 = *(shared_ptr<kratos::Attribute> **)(name.field_2._8_8_ + 0x58);
        if (psVar12 != psVar4) {
          local_40 = (Port *)&(local_40->super_Var).super_IRNode.attributes_;
          do {
            std::
            vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>
            ::emplace_back<std::shared_ptr<kratos::Attribute>const&>
                      ((vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>
                        *)local_40,psVar12);
            psVar12 = psVar12 + 1;
          } while (psVar12 != psVar4);
        }
      }
      else {
        local_40 = pPVar9;
        get_flatten_slices((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)local_108,(Var *)name.field_2._8_8_);
        local_b0 = slices.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        auVar10 = local_108;
        if (local_108 !=
            (undefined1  [8])
            slices.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          do {
            auStack_98 = (undefined1  [8])&name._M_string_length;
            lVar2 = *(long *)&(local_40->super_Var).super_IRNode.verilog_ln;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)auStack_98,lVar2,
                       (local_40->super_Var).super_IRNode.comment._M_dataplus._M_p + lVar2);
            puVar11 = (((pointer)auVar10)->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            puVar3 = (((pointer)auVar10)->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            if (puVar11 != puVar3) {
              do {
                local_58._vptr__Sp_counted_base = (_func_int **)(ulong)*puVar11;
                p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_98;
                p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name._M_dataplus._M_p;
                args.
                super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                .field_1.args_ = in_R9.args_;
                args.
                super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                .desc_ = (unsigned_long_long)
                         &p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ;
                format_str.size_ = 0x2d;
                format_str.data_ = (char *)0x7;
                fmt::v7::detail::vformat_abi_cxx11_
                          ((string *)__return_storage_ptr__,(detail *)"{0}_{1}",format_str,args);
                std::__cxx11::string::operator=
                          ((string *)auStack_98,(string *)__return_storage_ptr__);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)params._M_t._M_impl.super__Rb_tree_header._M_node_count != &local_118) {
                  operator_delete((void *)params._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                  local_118._M_allocated_capacity + 1);
                }
                puVar11 = puVar11 + 1;
              } while (puVar11 != puVar3);
              puVar11 = (((pointer)auVar10)->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
            }
            var = (Var *)(**(code **)(*(long *)name.field_2._8_8_ + 0x48))
                                   (name.field_2._8_8_,*puVar11);
            puVar8 = (((pointer)auVar10)->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if (4 < (ulong)((long)(((pointer)auVar10)->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar8)) {
              uVar13 = 1;
              do {
                iVar5 = (*(var->super_IRNode)._vptr_IRNode[9])(var,(ulong)puVar8[uVar13]);
                var = (Var *)CONCAT44(extraout_var,iVar5);
                uVar13 = uVar13 + 1;
                puVar8 = (((pointer)auVar10)->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
              } while (uVar13 < (ulong)((long)(((pointer)auVar10)->
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)puVar8 >> 2));
            }
            puVar8 = (var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (((long)(var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)puVar8 != 4) ||
               (*puVar8 != 1)) {
              this_01 = (InternalException *)__cxa_allocate_exception(0x10);
              p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   &local_58;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)
                         &p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ,"Unable to slice ports when flattening","");
              InternalException::InternalException
                        (this_01,(string *)
                                 &p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
              __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
            }
            pPVar9 = Generator::port(local_38,*(PortDirection *)(name.field_2._8_8_ + 0x270),
                                     (string *)auStack_98,var->var_width_,1);
            if (*(int *)(name.field_2._8_8_ + 0x270) == 0) {
              Var::assign((Var *)&p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,var,(AssignmentType)pPVar9);
              local_d0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              local_d0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = p_Stack_60;
              p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              Generator::add_stmt(local_38,&local_d0);
              if (local_d0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_d0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            else {
              std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<kratos::Var,void>
                        ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
                         __return_storage_ptr__,
                         (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                         &var->super_enable_shared_from_this<kratos::Var>);
              Var::assign((Var *)&p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,(shared_ptr<kratos::Var> *)pPVar9,
                          (AssignmentType)__return_storage_ptr__);
              local_c0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              local_c0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = p_Stack_60;
              p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              Generator::add_stmt(local_38,&local_c0);
              this_02 = local_120;
              if (local_c0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_c0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
            p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
            }
            psVar12 = *(shared_ptr<kratos::Attribute> **)(name.field_2._8_8_ + 0x50);
            psVar4 = *(shared_ptr<kratos::Attribute> **)(name.field_2._8_8_ + 0x58);
            if (psVar12 != psVar4) {
              do {
                std::
                vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>
                ::emplace_back<std::shared_ptr<kratos::Attribute>const&>
                          ((vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>
                            *)&(pPVar9->super_Var).super_IRNode.attributes_,psVar12);
                psVar12 = psVar12 + 1;
              } while (psVar12 != psVar4);
            }
            if (auStack_98 != (undefined1  [8])&name._M_string_length) {
              operator_delete((void *)auStack_98,name._M_string_length + 1);
            }
            auVar10 = (undefined1  [8])((long)auVar10 + 0x18);
          } while (auVar10 != (undefined1  [8])local_b0);
        }
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)local_108);
        pPVar9 = local_40;
      }
      if (p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      pPVar9 = (Port *)std::_Rb_tree_increment((_Rb_tree_node_base *)pPVar9);
    } while (pPVar9 != local_a8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
               *)local_158);
  return local_38;
}

Assistant:

Generator& create_wrapper_flatten(Generator* top, const std::string& wrapper_name) {
    auto& gen = top->context()->generator(wrapper_name);
    gen.add_child_generator(top->instance_name, top->shared_from_this());
    // copy the parameter definition over
    auto params = top->get_params();
    for (auto const& [name, param] : params) {
        auto& new_p = gen.parameter(name, 32);
        new_p.set_value(param->value());
        param->set_value(new_p.as<Param>());
    }

    auto const& ports = top->get_port_names();
    for (auto const& port_name : ports) {
        auto p = top->get_port(port_name);
        if (p->size().size() == 1 && p->size()[0] == 1) {
            // this is a normal wire
            auto& new_port = gen.port(*p);
            if (p->port_direction() == PortDirection::In) {
                gen.add_stmt(p->assign(new_port, AssignmentType::Blocking));
            } else {
                gen.add_stmt(new_port.assign(p, AssignmentType::Blocking));
            }
            copy_attrs(*p, new_port);
        } else {
            // need to flatten the array
            auto slices = get_flatten_slices(p.get());
            // create port for them based on the slice
            for (auto const& slice : slices) {
                std::string name = port_name;
                for (auto const& s : slice) name = ::format("{0}_{1}", name, s);
                auto* slice_port = &(*p)[slice[0]];
                for (uint64_t i = 1; i < slice.size(); i++) slice_port = &(*slice_port)[slice[i]];
                if (slice_port->size().size() != 1 || slice_port->size()[0] != 1)
                    throw InternalException("Unable to slice ports when flattening");
                auto& new_port = gen.port(p->port_direction(), name, slice_port->var_width());
                if (p->port_direction() == PortDirection::In) {
                    gen.add_stmt(slice_port->assign(new_port, AssignmentType::Blocking));
                } else {
                    gen.add_stmt(
                        new_port.assign(slice_port->shared_from_this(), AssignmentType::Blocking));
                }
                copy_attrs(*p, new_port);
            }
        }
    }
    return gen;
}